

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmDeviceInfo * Pm_GetDeviceInfo(PmDeviceID id)

{
  descriptor_type paVar1;
  
  Pm_Initialize();
  paVar1 = descriptors + (uint)id;
  if (pm_descriptor_index <= id) {
    paVar1 = (descriptor_type)0x0;
  }
  if (id < 0) {
    paVar1 = (descriptor_type)0x0;
  }
  return &paVar1->pub;
}

Assistant:

PMEXPORT const PmDeviceInfo* Pm_GetDeviceInfo( PmDeviceID id ) {
    Pm_Initialize(); /* no error check needed */
    if (id >= 0 && id < pm_descriptor_index) {
        return &descriptors[id].pub;
    }
    return NULL;
}